

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft4g.c
# Opt level: O0

void cft1st(int n,double *a,double *w)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  int iVar15;
  int iVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double x3i;
  double x3r;
  double x2i;
  double x2r;
  double x1i;
  double x1r;
  double x0i;
  double x0r;
  double wk3i;
  double wk3r;
  double wk2i;
  double wk2r;
  double wk1i;
  double wk1r;
  int local_28;
  int k2;
  int k1;
  int j;
  double *w_local;
  double *a_local;
  int n_local;
  
  dVar24 = *a;
  dVar17 = a[1];
  dVar18 = *a;
  dVar23 = a[2];
  dVar21 = a[1];
  dVar22 = a[3];
  dVar1 = a[4];
  dVar2 = a[6];
  dVar3 = a[5];
  *a = dVar24 + a[2] + a[4] + a[6];
  a[1] = dVar17 + a[3] + a[5] + a[7];
  a[4] = (dVar24 + a[2]) - (a[4] + a[6]);
  a[5] = (dVar17 + a[3]) - (a[5] + a[7]);
  a[2] = (dVar18 - dVar23) - (dVar3 - a[7]);
  a[3] = (dVar21 - dVar22) + (dVar1 - dVar2);
  a[6] = (dVar18 - dVar23) + (dVar3 - a[7]);
  a[7] = (dVar21 - dVar22) - (dVar1 - dVar2);
  dVar24 = w[2];
  dVar17 = a[8];
  dVar18 = a[9];
  dVar23 = a[8];
  dVar21 = a[10];
  dVar22 = a[9];
  dVar1 = a[0xb];
  dVar2 = a[0xc];
  dVar3 = a[0xc];
  dVar4 = a[0xd];
  a[8] = dVar17 + a[10] + dVar2 + a[0xe];
  a[9] = dVar18 + a[0xb] + a[0xd] + a[0xf];
  a[0xc] = (a[0xd] + a[0xf]) - (dVar18 + a[0xb]);
  a[0xd] = (dVar17 + a[10]) - (dVar2 + a[0xe]);
  dVar17 = (dVar23 - dVar21) - (dVar4 - a[0xf]);
  dVar18 = (dVar22 - dVar1) + (dVar3 - a[0xe]);
  a[10] = dVar24 * (dVar17 - dVar18);
  a[0xb] = dVar24 * (dVar17 + dVar18);
  dVar17 = (dVar4 - a[0xf]) + (dVar23 - dVar21);
  dVar18 = (dVar3 - a[0xe]) - (dVar22 - dVar1);
  a[0xe] = dVar24 * (dVar18 - dVar17);
  a[0xf] = dVar24 * (dVar18 + dVar17);
  local_28 = 0;
  for (k2 = 0x10; k2 < n; k2 = k2 + 0x10) {
    iVar15 = local_28 + 2;
    iVar16 = iVar15 * 2;
    dVar24 = w[iVar15];
    dVar17 = w[local_28 + 3];
    dVar18 = w[iVar16];
    dVar23 = w[iVar16 + 1];
    dVar19 = -(dVar17 * 2.0) * dVar23 + dVar18;
    dVar20 = dVar17 * 2.0 * dVar18 + -dVar23;
    dVar21 = a[k2];
    dVar22 = a[k2 + 2];
    dVar1 = a[k2 + 1];
    dVar2 = a[k2 + 3];
    dVar3 = a[k2];
    dVar4 = a[k2 + 2];
    dVar5 = a[k2 + 1];
    dVar6 = a[k2 + 3];
    dVar7 = a[k2 + 4];
    dVar8 = a[k2 + 6];
    dVar9 = a[k2 + 5];
    dVar10 = a[k2 + 7];
    dVar11 = a[k2 + 4];
    dVar12 = a[k2 + 6];
    dVar13 = a[k2 + 5];
    dVar14 = a[k2 + 7];
    a[k2] = dVar21 + dVar22 + dVar7 + dVar8;
    a[k2 + 1] = dVar1 + dVar2 + dVar9 + dVar10;
    dVar21 = (dVar21 + dVar22) - (dVar7 + dVar8);
    dVar22 = (dVar1 + dVar2) - (dVar9 + dVar10);
    a[k2 + 4] = dVar24 * dVar21 + -(dVar17 * dVar22);
    a[k2 + 5] = dVar24 * dVar22 + dVar17 * dVar21;
    dVar21 = (dVar3 - dVar4) - (dVar13 - dVar14);
    dVar22 = (dVar5 - dVar6) + (dVar11 - dVar12);
    a[k2 + 2] = dVar18 * dVar21 + -(dVar23 * dVar22);
    a[k2 + 3] = dVar18 * dVar22 + dVar23 * dVar21;
    dVar18 = (dVar3 - dVar4) + (dVar13 - dVar14);
    dVar23 = (dVar5 - dVar6) - (dVar11 - dVar12);
    a[k2 + 6] = dVar19 * dVar18 + -(dVar20 * dVar23);
    a[k2 + 7] = dVar19 * dVar23 + dVar20 * dVar18;
    dVar18 = w[iVar16 + 2];
    dVar23 = w[iVar16 + 3];
    dVar19 = -(dVar24 * 2.0) * dVar23 + dVar18;
    dVar20 = dVar24 * 2.0 * dVar18 + -dVar23;
    dVar21 = a[k2 + 8];
    dVar22 = a[k2 + 10];
    dVar1 = a[k2 + 9];
    dVar2 = a[k2 + 0xb];
    dVar3 = a[k2 + 8];
    dVar4 = a[k2 + 10];
    dVar5 = a[k2 + 9];
    dVar6 = a[k2 + 0xb];
    dVar7 = a[k2 + 0xc];
    dVar8 = a[k2 + 0xe];
    dVar9 = a[k2 + 0xd];
    dVar10 = a[k2 + 0xf];
    dVar11 = a[k2 + 0xc];
    dVar12 = a[k2 + 0xe];
    dVar13 = a[k2 + 0xd];
    dVar14 = a[k2 + 0xf];
    a[k2 + 8] = dVar21 + dVar22 + dVar7 + dVar8;
    a[k2 + 9] = dVar1 + dVar2 + dVar9 + dVar10;
    dVar21 = (dVar21 + dVar22) - (dVar7 + dVar8);
    dVar22 = (dVar1 + dVar2) - (dVar9 + dVar10);
    a[k2 + 0xc] = -dVar17 * dVar21 + -(dVar24 * dVar22);
    a[k2 + 0xd] = -dVar17 * dVar22 + dVar24 * dVar21;
    dVar24 = (dVar3 - dVar4) - (dVar13 - dVar14);
    dVar17 = (dVar5 - dVar6) + (dVar11 - dVar12);
    a[k2 + 10] = dVar18 * dVar24 + -(dVar23 * dVar17);
    a[k2 + 0xb] = dVar18 * dVar17 + dVar23 * dVar24;
    dVar24 = (dVar3 - dVar4) + (dVar13 - dVar14);
    dVar17 = (dVar5 - dVar6) - (dVar11 - dVar12);
    a[k2 + 0xe] = dVar19 * dVar24 + -(dVar20 * dVar17);
    a[k2 + 0xf] = dVar19 * dVar17 + dVar20 * dVar24;
    local_28 = iVar15;
  }
  return;
}

Assistant:

void cft1st(int n, double *a, double *w)
{
    int j, k1, k2;
    double wk1r, wk1i, wk2r, wk2i, wk3r, wk3i;
    double x0r, x0i, x1r, x1i, x2r, x2i, x3r, x3i;
    
    x0r = a[0] + a[2];
    x0i = a[1] + a[3];
    x1r = a[0] - a[2];
    x1i = a[1] - a[3];
    x2r = a[4] + a[6];
    x2i = a[5] + a[7];
    x3r = a[4] - a[6];
    x3i = a[5] - a[7];
    a[0] = x0r + x2r;
    a[1] = x0i + x2i;
    a[4] = x0r - x2r;
    a[5] = x0i - x2i;
    a[2] = x1r - x3i;
    a[3] = x1i + x3r;
    a[6] = x1r + x3i;
    a[7] = x1i - x3r;
    wk1r = w[2];
    x0r = a[8] + a[10];
    x0i = a[9] + a[11];
    x1r = a[8] - a[10];
    x1i = a[9] - a[11];
    x2r = a[12] + a[14];
    x2i = a[13] + a[15];
    x3r = a[12] - a[14];
    x3i = a[13] - a[15];
    a[8] = x0r + x2r;
    a[9] = x0i + x2i;
    a[12] = x2i - x0i;
    a[13] = x0r - x2r;
    x0r = x1r - x3i;
    x0i = x1i + x3r;
    a[10] = wk1r * (x0r - x0i);
    a[11] = wk1r * (x0r + x0i);
    x0r = x3i + x1r;
    x0i = x3r - x1i;
    a[14] = wk1r * (x0i - x0r);
    a[15] = wk1r * (x0i + x0r);
    k1 = 0;
    for (j = 16; j < n; j += 16) {
        k1 += 2;
        k2 = 2 * k1;
        wk2r = w[k1];
        wk2i = w[k1 + 1];
        wk1r = w[k2];
        wk1i = w[k2 + 1];
        wk3r = wk1r - 2 * wk2i * wk1i;
        wk3i = 2 * wk2i * wk1r - wk1i;
        x0r = a[j] + a[j + 2];
        x0i = a[j + 1] + a[j + 3];
        x1r = a[j] - a[j + 2];
        x1i = a[j + 1] - a[j + 3];
        x2r = a[j + 4] + a[j + 6];
        x2i = a[j + 5] + a[j + 7];
        x3r = a[j + 4] - a[j + 6];
        x3i = a[j + 5] - a[j + 7];
        a[j] = x0r + x2r;
        a[j + 1] = x0i + x2i;
        x0r -= x2r;
        x0i -= x2i;
        a[j + 4] = wk2r * x0r - wk2i * x0i;
        a[j + 5] = wk2r * x0i + wk2i * x0r;
        x0r = x1r - x3i;
        x0i = x1i + x3r;
        a[j + 2] = wk1r * x0r - wk1i * x0i;
        a[j + 3] = wk1r * x0i + wk1i * x0r;
        x0r = x1r + x3i;
        x0i = x1i - x3r;
        a[j + 6] = wk3r * x0r - wk3i * x0i;
        a[j + 7] = wk3r * x0i + wk3i * x0r;
        wk1r = w[k2 + 2];
        wk1i = w[k2 + 3];
        wk3r = wk1r - 2 * wk2r * wk1i;
        wk3i = 2 * wk2r * wk1r - wk1i;
        x0r = a[j + 8] + a[j + 10];
        x0i = a[j + 9] + a[j + 11];
        x1r = a[j + 8] - a[j + 10];
        x1i = a[j + 9] - a[j + 11];
        x2r = a[j + 12] + a[j + 14];
        x2i = a[j + 13] + a[j + 15];
        x3r = a[j + 12] - a[j + 14];
        x3i = a[j + 13] - a[j + 15];
        a[j + 8] = x0r + x2r;
        a[j + 9] = x0i + x2i;
        x0r -= x2r;
        x0i -= x2i;
        a[j + 12] = -wk2i * x0r - wk2r * x0i;
        a[j + 13] = -wk2i * x0i + wk2r * x0r;
        x0r = x1r - x3i;
        x0i = x1i + x3r;
        a[j + 10] = wk1r * x0r - wk1i * x0i;
        a[j + 11] = wk1r * x0i + wk1i * x0r;
        x0r = x1r + x3i;
        x0i = x1i - x3r;
        a[j + 14] = wk3r * x0r - wk3i * x0i;
        a[j + 15] = wk3r * x0i + wk3i * x0r;
    }
}